

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGenerator.cpp
# Opt level: O2

RandomGenerator * PyreNet::RandomGenerator::getInstance(void)

{
  RandomGenerator *pRVar1;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lg;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_28,(mutex_type *)instanceMutex);
  if (randomGenerator == (RandomGenerator *)0x0) {
    pRVar1 = (RandomGenerator *)operator_new(8);
    RandomGenerator(pRVar1);
    randomGenerator = pRVar1;
  }
  pRVar1 = randomGenerator;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return pRVar1;
}

Assistant:

RandomGenerator *RandomGenerator::getInstance() {
        std::unique_lock<std::mutex> lg(instanceMutex);
        if (randomGenerator == nullptr)
            randomGenerator = new RandomGenerator();
        return randomGenerator;
    }